

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O0

void __thiscall QAbstractSocketPrivate::canCloseNotification(QAbstractSocketPrivate *this)

{
  bool bVar1;
  QAbstractSocket *pQVar2;
  qint64 qVar3;
  qint64 qVar4;
  QObject *obj;
  QAbstractSocketPrivate *in_RDI;
  bool hadReadFromSocket;
  qint64 oldReadBufferMaxSize;
  qint64 newBytes;
  QAbstractSocket *q;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  ConnectionType c;
  char *member;
  
  pQVar2 = q_func(in_RDI);
  if ((in_RDI->isBuffered & 1U) == 0) {
    if (((in_RDI->socketType == TcpSocket) || (in_RDI->socketType == SctpSocket)) &&
       (in_RDI->socketEngine != (QAbstractSocketEngine *)0x0)) {
      emitReadyRead((QAbstractSocketPrivate *)
                    CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                    (int)((ulong)in_RDI >> 0x20));
    }
  }
  else {
    qVar3 = QIODevicePrivate::QRingBufferRef::size((QRingBufferRef *)in_RDI);
    member = (char *)in_RDI->readBufferMaxSize;
    in_RDI->readBufferMaxSize = 0;
    bVar1 = readFromSocket(this);
    c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffdc);
    in_RDI->readBufferMaxSize = (qint64)member;
    if (bVar1) {
      qVar4 = QIODevicePrivate::QRingBufferRef::size((QRingBufferRef *)in_RDI);
      obj = (QObject *)(qVar4 - qVar3);
      if (obj != (QObject *)0x0) {
        emitReadyRead((QAbstractSocketPrivate *)CONCAT44(c,in_stack_ffffffffffffffd8),
                      (int)((ulong)in_RDI >> 0x20));
        QMetaObject::invokeMethod<>(obj,member,c);
      }
    }
    else {
      (**(code **)(*(long *)pQVar2 + 0x100))();
    }
  }
  return;
}

Assistant:

void QAbstractSocketPrivate::canCloseNotification()
{
    Q_Q(QAbstractSocket);
    // Note that this method is only called on Windows. Other platforms close in the canReadNotification()

#if defined (QABSTRACTSOCKET_DEBUG)
    qDebug("QAbstractSocketPrivate::canCloseNotification()");
#endif

    qint64 newBytes = 0;
    if (isBuffered) {
        // Try to read to the buffer, if the read fail we can close the socket.
        newBytes = buffer.size();
        qint64 oldReadBufferMaxSize = readBufferMaxSize;
        readBufferMaxSize = 0; // temporarily disable max read buffer, we want to empty the OS buffer
        bool hadReadFromSocket = readFromSocket();
        readBufferMaxSize = oldReadBufferMaxSize;
        if (!hadReadFromSocket) {
            q->disconnectFromHost();
            return;
        }
        newBytes = buffer.size() - newBytes;
        if (newBytes) {
            // If there was still some data to be read from the socket
            // then we could get another FD_READ. The disconnect will
            // then occur when we read from the socket again and fail
            // in canReadNotification or by the manually created
            // closeNotification below.
            emitReadyRead();

            QMetaObject::invokeMethod(socketEngine, "closeNotification", Qt::QueuedConnection);
        }
    } else if ((socketType == QAbstractSocket::TcpSocket ||
                socketType == QAbstractSocket::SctpSocket) && socketEngine) {
        emitReadyRead();
    }
}